

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAdvancedBlendTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendEquationIndexedStateCase::iterate
          (BlendEquationIndexedStateCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  GLenum err;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  Enum<int,_2UL> *value;
  long lVar4;
  allocator<char> local_111;
  ScopedLogSection section;
  CallLogWrapper gl;
  code *local_f0;
  GLenum local_e8;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  ResultCollector result;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_KHR_blend_equation_advanced");
    if (bVar2) {
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_EXT_draw_buffers_indexed");
      if (bVar2) goto LAB_01313c4e;
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_EXT_draw_buffers_indexed is not supported",
                 "m_context.getContextInfo().isExtensionSupported(\"GL_EXT_draw_buffers_indexed\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAdvancedBlendTests.cpp"
                 ,0x2d1);
    }
    else {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_KHR_blend_equation_advanced is not supported",
                 "m_context.getContextInfo().isExtensionSupported(\"GL_KHR_blend_equation_advanced\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAdvancedBlendTests.cpp"
                 ,0x2d0);
    }
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_01313c4e:
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0," // ERROR: ",(allocator<char> *)&local_c0);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  gl.m_enableLog = true;
  for (lVar4 = 0; lVar4 < this->m_numEquations; lVar4 = lVar4 + 1) {
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Type",&local_111);
    local_e8 = this->m_equations[lVar4];
    local_f0 = glu::getBlendEquationName;
    de::toString<tcu::Format::Enum<int,2ul>>(&local_a0,(de *)&local_f0,value);
    std::operator+(&local_c0,"Test ",&local_a0);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_e0,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_e0);
    glu::CallLogWrapper::glBlendEquationi(&gl,2,this->m_equations[lVar4]);
    err = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(err,"glBlendEquationi",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAdvancedBlendTests.cpp"
                    ,0x2de);
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,2,this->m_equations[lVar4],this->m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
  }
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

BlendEquationIndexedStateCase::IterateResult BlendEquationIndexedStateCase::iterate (void)
{
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		TCU_CHECK_AND_THROW(NotSupportedError, m_context.getContextInfo().isExtensionSupported("GL_KHR_blend_equation_advanced"), "GL_KHR_blend_equation_advanced is not supported");
		TCU_CHECK_AND_THROW(NotSupportedError, m_context.getContextInfo().isExtensionSupported("GL_EXT_draw_buffers_indexed"), "GL_EXT_draw_buffers_indexed is not supported");
	}

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	for (int ndx = 0; ndx < m_numEquations; ++ndx)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Type", "Test " + de::toString(glu::getBlendEquationStr(m_equations[ndx])));

		gl.glBlendEquationi(2, m_equations[ndx]);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "glBlendEquationi");

		gls::StateQueryUtil::verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION, 2, m_equations[ndx], m_type);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}